

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

bool __thiscall MapLoader::fileIsValid(MapLoader *this)

{
  bool bVar1;
  long lVar2;
  istream *piVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  string *psVar8;
  allocator local_491;
  string *local_490;
  int local_484;
  MapLoader *local_480;
  string line;
  string mapExt;
  ifstream input;
  byte abStack_418 [488];
  ofstream output;
  
  std::__cxx11::string::string((string *)&mapExt,".map",(allocator *)&input);
  psVar8 = &this->filePath;
  local_480 = this;
  lVar2 = std::__cxx11::string::find((string *)psVar8,(ulong)&mapExt);
  if (lVar2 == -1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "The file requested does not contain a .map extension.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::ofstream::ofstream(&output);
    std::ifstream::ifstream(&input);
    std::ifstream::open((string *)&input,(_Ios_Openmode)psVar8);
    if ((abStack_418[*(long *)(_input + -0x18)] & 5) == 0) {
      local_490 = (string *)psVar8;
      std::__cxx11::string::string((string *)&line,"",&local_491);
      iVar6 = 0;
      iVar7 = 0;
      do {
        iVar6 = iVar6 + 1;
        do {
          iVar5 = iVar6;
          piVar3 = std::operator>>((istream *)&input,(string *)&line);
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Number of nodes ");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar7);
            std::endl<char,std::char_traits<char>>(poVar4);
            if (iVar7 == 0) {
              std::ifstream::close();
            }
            else {
              std::ifstream::close();
              local_480->nodeCount = iVar7;
            }
            std::__cxx11::string::~string((string *)&line);
            std::ifstream::~ifstream(&input);
            std::ofstream::~ofstream(&output);
            std::__cxx11::string::~string((string *)&mapExt);
            return iVar7 != 0;
          }
          bVar1 = std::operator==(&line,"@node");
          iVar6 = iVar5 + 1;
        } while (!bVar1);
        std::operator>>((istream *)&input,(string *)&line);
        bVar1 = std::operator!=(&line,"{");
        if (bVar1) {
          std::ifstream::close();
          poVar4 = std::operator<<((ostream *)&std::cout,"Missing opening brace in file ");
          poVar4 = std::operator<<(poVar4,local_490);
          poVar4 = std::operator<<(poVar4," near line ");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
          poVar4 = std::operator<<(poVar4,".");
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_001116bc;
        }
        std::operator>>((istream *)&input,(string *)&line);
        bVar1 = std::operator!=(&line,"name:");
        if (bVar1) {
          std::ifstream::close();
          poVar4 = std::operator<<((ostream *)&std::cout,"Missing node name field in file ");
          poVar4 = std::operator<<(poVar4,local_490);
          poVar4 = std::operator<<(poVar4," near line ");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar5 + 2);
          poVar4 = std::operator<<(poVar4,".");
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_001116bc;
        }
        while( true ) {
          bVar1 = std::operator!=(&line,"type:");
          if (!bVar1) break;
          bVar1 = std::operator==(&line,"adjacent:");
          if (bVar1) break;
          bVar1 = std::operator==(&line,"}");
          if (bVar1) break;
          std::operator>>((istream *)&input,(string *)&line);
          iVar6 = iVar6 + 1;
        }
        bVar1 = std::operator!=(&line,"type:");
        if (bVar1) {
          std::ifstream::close();
          poVar4 = std::operator<<((ostream *)&std::cout,"Missing type field in file ");
          poVar4 = std::operator<<(poVar4,local_490);
          poVar4 = std::operator<<(poVar4," near line ");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6 + 1);
          poVar4 = std::operator<<(poVar4,".");
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_001116bc;
        }
        std::operator>>((istream *)&input,(string *)&line);
        local_484 = iVar7 + 1;
        bVar1 = std::operator==(&line,"master");
        if (!bVar1) {
          bVar1 = std::operator==(&line,"inner");
          if (!bVar1) {
            bVar1 = std::operator==(&line,"outer");
            if (!bVar1) {
              std::ifstream::close();
              poVar4 = std::operator<<((ostream *)&std::cout,"Invalid type field in file ");
              poVar4 = std::operator<<(poVar4,local_490);
              poVar4 = std::operator<<(poVar4," near line ");
              poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6 + 2);
              poVar4 = std::operator<<(poVar4,".");
              std::endl<char,std::char_traits<char>>(poVar4);
              goto LAB_001116bc;
            }
          }
        }
        iVar6 = iVar6 + 2;
        iVar7 = 0;
        while( true ) {
          piVar3 = std::operator>>((istream *)&input,(string *)&line);
          if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
          bVar1 = std::operator!=(&line,"}");
          if (!bVar1) break;
          iVar6 = iVar6 + 1;
          bVar1 = std::operator==(&line,"adjacent:");
          iVar7 = iVar7 + (uint)bVar1;
        }
        if (iVar7 == 0) {
          std::ifstream::close();
          poVar4 = std::operator<<((ostream *)&std::cout,"No adjacent nodes found in ");
          poVar4 = std::operator<<(poVar4,local_490);
          poVar4 = std::operator<<(poVar4," near line ");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
          poVar4 = std::operator<<(poVar4,".");
          std::endl<char,std::char_traits<char>>(poVar4);
          goto LAB_001116bc;
        }
        bVar1 = std::operator!=(&line,"}");
        iVar7 = local_484;
      } while (!bVar1);
      std::ifstream::close();
      poVar4 = std::operator<<((ostream *)&std::cout,"Missing closing brace in file ");
      poVar4 = std::operator<<(poVar4,local_490);
      poVar4 = std::operator<<(poVar4," near line ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
      poVar4 = std::operator<<(poVar4,".");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      std::ifstream::close();
      poVar4 = std::operator<<((ostream *)&std::cerr,"The file at ");
      poVar4 = std::operator<<(poVar4,(string *)psVar8);
      poVar4 = std::operator<<(poVar4," could not be opened.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
LAB_001116bc:
  exit(0);
}

Assistant:

bool MapLoader::fileIsValid()
{
  //method to check if the file is valid

  //before doing anything, check if the file path contains a .map extension
  string mapExt = ".map";

  if(filePath.find(mapExt) == string::npos)
  {
    cerr << "The file requested does not contain a .map extension." << endl;
    exit(0);
    return false;
  }


  //first we will attempt to open the file
  ofstream output;
  ifstream input; //the input stream associated to out file
  input.open(filePath); //try opening the file


  if(!input)
  {
    //if the input file could not be opened, then that means that the input file is not valid
    //therefore close the stream and return false
    input.close();
    cerr << "The file at " << filePath << " could not be opened." << endl;
    exit(0);
    return false;
  }

  //if we passed this point, it means that the file is open

  //we need to check each node to make sure that it is correctly formed
  int numbOfNodes = 0; //the count of the number of nodes in the file
  int lineNumber = 0; //the line we are at

  //now we need to count the number of times the word "@node" is contained in the file
  string line = ""; //the current line being read
  while(input >> line) //while the input stream still has lines to read keep reading
  {
    lineNumber++;

    if(line == "@node") //if the line is equal to "@node", this is the inclusion of another node
    {
      numbOfNodes++;
      //now we know that we are at the beginning of a node declaration
      //check the next line to see if it is a "{"
      input >> line;
      lineNumber++;
      if(line != "{")
      {
        input.close();
        cout << "Missing opening brace in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //then check if the line after that contains a name field
      input >> line;
      lineNumber++;
      if(line != "name:")
      {
        input.close();
        cout << "Missing node name field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false; //if the next line does not contain a name field then we return false
      }

      //then check if the line after that contains a type field
      while(line != "type:" && !(line == "adjacent:" || line == "}"))
      {
        input >> line;
        lineNumber++;
      }

      if(line != "type:")
      {
        input.close();
        cout << "Missing type field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //then check that the type is valid
      input >> line;
      lineNumber++;
      if(!(line == "master" || line == "inner" || line == "outer"))
      {
        input.close();
        cout << "Invalid type field in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
      }

      //now we need to make sure that the node has at least one adjacent node to make sure that the graph will be a connected graph
      int adjacentCount = 0;
      while(input >> line && line != "}")
      {
        lineNumber++;
        if(line == "adjacent:")
        {
          adjacentCount ++;
        }
      }

      //if by the end of the loop the adjacent count is still zero, then the file is not valid
      if(adjacentCount == 0)
      {
        input.close();
        cout << "No adjacent nodes found in " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

      //now that we have reached the last adjacent node, check if the current line contains a "}"
      if(line != "}")
      {
        input.close();
        cout << "Missing closing brace in file " << filePath << " near line " << lineNumber << "." << endl;
        exit(0);
        return false;
      }

    }

  }

  //if we made it to this point without returning, then that means the file is valid and we return true
  //as long as there is more than one node

  cout << "Number of nodes " << numbOfNodes << endl;
  if(numbOfNodes > 0)
  {
    input.close();
    nodeCount = numbOfNodes;
    return true;
  }

  //if there was not more than one node, then return false;
  input.close();
  return false;

}